

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

bool Json::isAnyCharRequiredQuoting(char *s,size_t n)

{
  long in_RSI;
  byte *in_RDI;
  char *cur;
  char *end;
  byte *local_28;
  
  if (in_RDI == (byte *)0x0 && in_RSI != 0) {
    __assert_fail("s || !n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/jsoncpp/src/lib_json/json_writer.cpp"
                  ,0xb4,"bool Json::isAnyCharRequiredQuoting(const char *, size_t)");
  }
  local_28 = in_RDI;
  while( true ) {
    if (in_RDI + in_RSI <= local_28) {
      return false;
    }
    if ((((*local_28 == 0x5c) || (*local_28 == 0x22)) || ((char)*local_28 < ' ')) ||
       (*local_28 < 0x80)) break;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

static bool isAnyCharRequiredQuoting(char const* s, size_t n) {
  assert(s || !n);

  char const* const end = s + n;
  for (char const* cur = s; cur < end; ++cur) {
    if (*cur == '\\' || *cur == '\"' || *cur < ' ' ||
        static_cast<unsigned char>(*cur) < 0x80)
      return true;
  }
  return false;
}